

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O3

ErrorNumber
doRangeTestFixSize(RangeTestFunction testFunction,void *opaqueData,TA_Integer refOutBeg,
                  TA_Integer refOutNbElement,TA_Integer refLookback,TA_Real *refBuffer,
                  TA_Integer *refBufferInt,TA_FuncUnstId unstId,TA_Integer fixSize,uint outputNb,
                  uint integerTolerance)

{
  TA_RetCode TVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  double *__ptr;
  undefined4 *__ptr_00;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  undefined4 in_register_00000084;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  TA_Integer outputNbElement;
  uint local_f4;
  uint local_f0;
  TA_Integer outputBegIdx;
  double local_e8;
  double local_e0;
  ulong local_d8;
  double local_d0;
  ulong local_c8;
  uint local_bc;
  TA_Integer lookback;
  TA_FuncUnstId local_b4;
  int local_b0;
  uint outputIsInteger;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  TA_Real *local_80;
  TA_Integer *local_78;
  uint local_6c;
  uint local_68;
  int local_64;
  ulong local_60;
  void *local_58;
  long local_50;
  RangeTestFunction local_48;
  long local_40;
  TA_Real *local_38;
  
  local_40 = CONCAT44(in_register_00000084,refLookback);
  uVar12 = (ulong)unstId;
  local_f0 = refOutBeg;
  local_48 = testFunction;
  local_38 = refBuffer;
  __ptr = (double *)malloc(uVar12 * 8 + 0x10);
  if (__ptr == (double *)0x0) {
    return TA_TESTUTIL_DRT_ALLOC_ERR;
  }
  __ptr_00 = (undefined4 *)malloc((uVar12 + 2) * 4);
  *__ptr = 9.1349043e-200;
  uVar8 = unstId + TA_FUNC_UNST_ADXR;
  local_50 = (long)(int)uVar8;
  __ptr[local_50] = 8.1489031e-158;
  *__ptr_00 = 0x80000000;
  __ptr_00[local_50] = 0x80000000;
  local_b4 = refOutNbElement;
  if (unstId < TA_FUNC_UNST_ADXR) {
    if (unstId < refOutNbElement) {
      local_b4 = unstId;
    }
  }
  else {
    uVar6 = 1;
    do {
      __ptr[uVar6] = -2.849284e-199;
      __ptr_00[uVar6] = 0x80000000;
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
    if (unstId < refOutNbElement) {
      local_b4 = unstId;
    }
    if (0xfc < unstId) goto LAB_0011cf26;
  }
  local_b0 = 0xfc - unstId;
  local_80 = __ptr + 1;
  local_78 = __ptr_00 + 1;
  local_d0 = *(double *)
              (&DAT_001878e0 + (ulong)((TA_FuncUnstId)refBufferInt == TA_FUNC_UNST_T3) * 8);
  local_6c = outputNb * 2;
  local_68 = outputNb * 3;
  local_d8 = (ulong)uVar8 + 2 & 0xfffffffffffffffc;
  lVar5 = (ulong)uVar8 - 2;
  local_98._8_4_ = (int)lVar5;
  local_98._0_8_ = lVar5;
  local_98._12_4_ = (int)((ulong)lVar5 >> 0x20);
  local_60 = (ulong)(uVar8 & 0xfffffffe);
  uVar8 = 0;
  local_c8 = uVar12;
  local_bc = refOutNbElement;
  local_58 = opaqueData;
  do {
    local_f4 = (unstId + uVar8) - 1;
    TVar1 = CallTestFunction(local_48,uVar8,local_f4,local_80,local_78,&outputBegIdx,
                             &outputNbElement,&lookback,opaqueData,fixSize,&outputIsInteger);
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: doRangeTestFixSize testFunction return error=(%d) (%d,%d)\n",(ulong)TVar1,
             (ulong)(uint)unstId,(ulong)uVar8);
      free(__ptr);
      free(__ptr_00);
      return TA_TESTUTIL_DRT_RETCODE_ERR;
    }
    if (outputNbElement != 0) {
      iVar11 = outputBegIdx - local_f0;
      if (((outputBegIdx < (int)local_f0) || (outputBegIdx < (int)uVar8)) ||
         (local_64 = (int)local_c8 + uVar8, local_64 <= outputBegIdx)) {
        puts("Fail: doRangeTestFixSize bad outBegIdx");
        printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)local_f4,
               (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_c8);
        printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f0,
               (ulong)(uint)refOutNbElement);
        free(__ptr);
        free(__ptr_00);
        return TA_TESTUTIL_DRT_BAD_OUTBEGIDX;
      }
      if (local_b4 < outputNbElement) {
        puts("Fail: doRangeTestFixSize Incorrect outputNbElement");
        printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)local_f4,
               (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_c8);
        printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f0,
               (ulong)(uint)refOutNbElement);
        free(__ptr);
        return TA_TESTUTIL_DRT_BAD_OUTNBLEMENT;
      }
      if (outputBegIdx < lookback) {
        printf("Fail: doRangeTestFixSize Lookback calculation too high? (%d)\n");
        printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)local_f4,
               (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_c8);
        printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f0,
               (ulong)(uint)refOutNbElement);
        free(__ptr);
        free(__ptr_00);
        return TA_TESTUTIL_DRT_LOOKBACK_TOO_HIGH;
      }
      if (outputNbElement < 1) goto LAB_0011d6cf;
      uVar7 = 0;
      goto LAB_0011d0e2;
    }
    if ((lookback < (int)uVar8) || (lookback < (int)local_f4)) {
      printf("Fail: doRangeTestFixSize data missing (%d,%d,%d)\n",(ulong)uVar8);
      free(__ptr);
      free(__ptr_00);
      return TA_TESTUTIL_DRT_MISSING_DATA;
    }
    uVar7 = uVar8;
    if ((int)(uVar8 + 100) <= local_b0 && 0x1e < (int)uVar8) {
      iVar11 = rand();
      uVar7 = uVar8 + iVar11 % 100 + 0x28;
    }
    uVar8 = uVar7 + 1;
  } while ((int)uVar7 < local_b0);
LAB_0011cf26:
  free(__ptr);
  free(__ptr_00);
  return TA_TEST_PASS;
LAB_0011d0e2:
  lVar5 = (long)(int)(iVar11 + uVar7);
  if (outputIsInteger == 0) {
    if (outputNb != 0xffffffff) {
      dVar14 = local_80[(int)uVar7];
      dVar13 = *(double *)(local_40 + lVar5 * 8);
      if ((TA_FuncUnstId)refBufferInt == TA_FUNC_UNST_NONE) {
        if ((dVar14 <= dVar13 + -1e-09) || (dVar13 + 1e-09 <= dVar14)) goto LAB_0011dca5;
      }
      else if ((1e-05 <= dVar14) || (1e-05 <= dVar13)) {
        local_e8 = dVar13;
        local_e0 = dVar14;
        if ((int)outputNb < 100) {
          if (outputNb == 0) {
            uVar3 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
            dVar14 = (double)(uVar3 + uVar7 + 1);
            if ((local_d0 < dVar14) &&
               (0.5 / (dVar14 - local_d0) <
                (double)(~-(ulong)(local_e8 < local_e0) & (ulong)((local_e8 - local_e0) / local_e8)
                        | (ulong)((local_e0 - local_e8) / local_e0) & -(ulong)(local_e8 < local_e0))
               )) {
              printf("\nFail: Value out of tolerance range (%g,%g)\n");
              dVar14 = local_e0;
              dVar13 = local_e8;
              goto LAB_0011dca5;
            }
          }
          else if (outputNb == 10) {
            local_a8._0_8_ =
                 (double)(~-(ulong)(dVar13 < dVar14) & (ulong)(dVar13 - dVar14) |
                         (ulong)(dVar14 - dVar13) & -(ulong)(dVar13 < dVar14)) * 10.0;
            local_a8._8_8_ = 0;
            uVar3 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
            if ((local_d0 < (double)(uVar3 + uVar7 + 1)) && (1 < (int)(double)local_a8._0_8_)) {
              pcVar10 = "\nFail: Value diffferent by more than 1/10 (%f)\n";
              goto LAB_0011dc8c;
            }
          }
          else {
LAB_0011d5da:
            uVar9 = (uint)(long)dVar13;
            uVar4 = (uint)(long)dVar14;
            uVar3 = uVar9 - uVar4;
            if (uVar9 < uVar4) {
              uVar3 = -(uVar9 - uVar4);
            }
            uVar12 = (ulong)uVar3;
            uVar4 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
            uVar4 = uVar4 + uVar7 + 1;
            if (local_d0 < (double)uVar4) {
              if (uVar4 < 100) {
                if (local_68 <= uVar3) {
                  pcVar10 = "\nFail: Value out of 3*tolerance range (%d,%d)\n";
LAB_0011dda5:
                  printf(pcVar10,uVar12,(ulong)outputNb);
                  dVar14 = local_e0;
                  dVar13 = local_e8;
LAB_0011dca5:
                  local_e8 = dVar13;
                  local_e0 = dVar14;
                  printf("Fail: doRangeTestFixSize diff data for idx=%d (%e,%e)\n",dVar14,
                         (ulong)uVar7);
                  printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)local_f4,
                         (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_c8);
                  printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",
                         (ulong)local_f0,(ulong)local_bc);
                  if ((local_e0 != 0.0) || (NAN(local_e0))) {
                    printf("Fail: Diff %g %%\n",((local_e8 - local_e0) / local_e0) * 100.0);
                  }
                  free(__ptr);
                  free(__ptr_00);
                  return TA_TESTUTIL_DRT_DATA_DIFF;
                }
              }
              else if (uVar4 < 0x96) {
                if (local_6c <= uVar3) {
                  pcVar10 = "\nFail: Value out of 2*tolerance range (%d,%d)\n";
                  goto LAB_0011dda5;
                }
              }
              else if (uVar4 < 200) {
                if (outputNb <= uVar3) {
                  pcVar10 = "\nFail: Value out of tolerance range (%d,%d)\n";
                  goto LAB_0011dda5;
                }
              }
              else if (uVar3 != 0) {
                pcVar10 = "\nFail: Value not equal (difference is %d)\n";
                goto LAB_0011dd61;
              }
            }
          }
        }
        else if (outputNb == 100) {
          local_a8._0_8_ =
               (double)(~-(ulong)(dVar13 < dVar14) & (ulong)(dVar13 - dVar14) |
                       (ulong)(dVar14 - dVar13) & -(ulong)(dVar13 < dVar14)) * 100.0;
          local_a8._8_8_ = 0;
          uVar3 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
          if ((local_d0 < (double)(uVar7 + 1 + uVar3)) && (1 < (int)(double)local_a8._0_8_)) {
            pcVar10 = "\nFail: Value diffferent by more than 1/100 (%f)\n";
LAB_0011dc8c:
            printf(pcVar10,local_a8._0_8_);
            dVar14 = local_e0;
            dVar13 = local_e8;
            goto LAB_0011dca5;
          }
        }
        else if (outputNb == 0x168) {
          uVar3 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
          if (local_d0 < (double)(uVar3 + uVar7 + 1)) {
            uVar9 = (uint)(long)local_e8;
            uVar4 = (uint)(long)local_e0;
            uVar3 = uVar9 - uVar4;
            if (uVar9 < uVar4) {
              uVar3 = -(uVar9 - uVar4);
            }
            uVar12 = (ulong)uVar3;
            if ((1 < uVar3) &&
               (0.1 < (double)(~-(ulong)(local_e8 < local_e0) &
                               (ulong)((local_e8 - local_e0) / local_e8) |
                              (ulong)((local_e0 - local_e8) / local_e0) &
                              -(ulong)(local_e8 < local_e0)))) {
              pcVar10 = "\nFail: Value diffferent by more than 10 percent over 1 degree (%d)\n";
LAB_0011dd61:
              printf(pcVar10,uVar12);
              dVar14 = local_e0;
              dVar13 = local_e8;
              goto LAB_0011dca5;
            }
          }
        }
        else {
          if (outputNb != 1000) goto LAB_0011d5da;
          local_a8._0_8_ =
               (double)(~-(ulong)(dVar13 < dVar14) & (ulong)(dVar13 - dVar14) |
                       (ulong)(dVar14 - dVar13) & -(ulong)(dVar13 < dVar14)) * 1000.0;
          local_a8._8_8_ = 0;
          uVar3 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
          if ((local_d0 < (double)(uVar3 + uVar7 + 1)) && (1 < (int)(double)local_a8._0_8_)) {
            pcVar10 = "\nFail: Value diffferent by more than 1/1000 (%f)\n";
            goto LAB_0011dc8c;
          }
        }
      }
    }
  }
  else if (local_78[(int)uVar7] != *(int *)((long)local_38 + lVar5 * 4)) {
    printf("Fail: doRangeTestFixSize diff data for idx=%d (%d,%d)\n",(ulong)uVar7);
    printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)local_f4,
           (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_c8);
    printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f0,
           (ulong)local_bc);
    free(__ptr);
    free(__ptr_00);
    return TA_TESTUTIL_DRT_DATA_DIFF_INT;
  }
  if ((0x1e < outputNbElement) &&
     (uVar3 = outputNbElement - 0x14, (int)uVar7 < (int)uVar3 && 0x14 < (int)uVar7)) {
    iVar2 = rand();
    uVar7 = iVar2 % 200 + uVar7;
    if ((int)uVar3 <= (int)uVar7) {
      uVar7 = uVar3;
    }
  }
  uVar7 = uVar7 + 1;
  refOutNbElement = local_bc;
  if (outputNbElement <= (int)uVar7) {
LAB_0011d6cf:
    uVar12 = local_c8;
    if (lookback <= (int)uVar8) {
      lookback = uVar8;
    }
    iVar11 = local_64 - lookback;
    if (local_64 - lookback == 0 || local_64 < lookback) {
      iVar11 = 0;
    }
    if (outputNbElement == (int)local_c8) {
      if ((*__ptr != 9.1349043e-200) || (NAN(*__ptr))) {
        printf("Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX (%e)\n");
      }
      else {
        printf("Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX_INT (%d)\n");
      }
      printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)local_f4,
             (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,uVar12 & 0xffffffff);
      printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f0,
             (ulong)(uint)refOutNbElement);
      free(__ptr);
      free(__ptr_00);
      return TA_TESTUTIL_DRT_BAD_PREFIX;
    }
    if ((local_80[iVar11] == -2.849284e-199) && (!NAN(local_80[iVar11]))) {
      printf("Fail: doRangeTestFixSize out-of-bound output  (%d)\n");
      printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)local_f4,
             (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,uVar12 & 0xffffffff);
      printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f0,
             (ulong)(uint)refOutNbElement);
      free(__ptr);
      free(__ptr_00);
      return TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT_INT;
    }
    printf("Fail: doRangeTestFixSize out-of-bound output (%e)\n");
    printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)local_f4,
           (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,uVar12 & 0xffffffff);
    printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f0,
           (ulong)(uint)refOutNbElement);
    free(__ptr);
    free(__ptr_00);
    return TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT;
  }
  goto LAB_0011d0e2;
}

Assistant:

static ErrorNumber doRangeTestFixSize( RangeTestFunction testFunction,
                                       void *opaqueData,
                                       TA_Integer refOutBeg,
                                       TA_Integer refOutNbElement,
                                       TA_Integer refLookback,
                                       const TA_Real *refBuffer,
                                       const TA_Integer *refBufferInt,
                                       TA_FuncUnstId unstId,
                                       TA_Integer fixSize,
                                       unsigned int outputNb,
                                       unsigned int integerTolerance )
{
   TA_RetCode retCode;
   TA_Real *outputBuffer;
   TA_Real val1, val2;
   TA_Integer i, temp;
   TA_Integer outputBegIdx, outputNbElement, lookback;
   TA_Integer startIdx, endIdx, relativeIdx, outputSizeByOptimalLogic;
   TA_Integer *outputBufferInt;
   unsigned int outputIsInteger;

   (void)refLookback;

   /* Allocate the output buffer (+prefix and suffix memory guard). */
   outputBuffer = (TA_Real *)TA_Malloc( (fixSize+2) * sizeof( TA_Real ) );

   if( !outputBuffer )
      return TA_TESTUTIL_DRT_ALLOC_ERR;

   outputBufferInt = (TA_Integer *)TA_Malloc( (fixSize+2) * sizeof( TA_Integer ) );

   if( !refBufferInt )
   {
      TA_Free( outputBuffer );
      return TA_TESTUTIL_DRT_ALLOC_ERR;
   }

   outputBuffer[0] = RESV_PATTERN_PREFIX;
   outputBuffer[fixSize+1] = RESV_PATTERN_SUFFIX;

   outputBufferInt[0] = RESV_PATTERN_PREFIX_INT;
   outputBufferInt[fixSize+1] = RESV_PATTERN_SUFFIX_INT;

   /* Initialize the outputs with improbable values. */
   for( i=1; i <= fixSize; i++ )
   {
      outputBuffer[i] = RESV_PATTERN_IMPROBABLE;
      outputBufferInt[i] = RESV_PATTERN_IMPROBABLE_INT;
   }

   /* Test for a large number of possible startIdx */
   for( startIdx=0; startIdx <= (MAX_RANGE_SIZE-fixSize); startIdx++ )
   {
      /* Call the TA function. */
      endIdx = startIdx+fixSize-1;
      retCode = CallTestFunction( testFunction, startIdx, endIdx,
                              &outputBuffer[1], &outputBufferInt[1],
                              &outputBegIdx, &outputNbElement, &lookback,
                              opaqueData, outputNb, &outputIsInteger );

      if( retCode != TA_SUCCESS )
      {
          /* No call shall never fail here. When the range
           * is "out-of-range" the function shall still return
           * TA_SUCCESS with the outNbElement equal to zero.
           */
         printf( "Fail: doRangeTestFixSize testFunction return error=(%d) (%d,%d)\n", retCode, fixSize, startIdx );
         TA_Free( outputBuffer );
         TA_Free( outputBufferInt );
         return TA_TESTUTIL_DRT_RETCODE_ERR;
      }
      else
      {
         /* Possible startIdx gap of the output shall be always the
          * same regardless of the range.
          */
         if( outputNbElement == 0 )
         {
            /* Trap cases where there is no output. */
            if( (startIdx > lookback) || (endIdx > lookback) )
            {
               /* Whenever startIdx is greater than lookback, some data
                * shall be return. Same idea with endIdx.
                *
                * Note:
                *  some output will never start at the startIdx, particularly
                *  when a TA function have multiple output. Usually, the first output
                *  will be between startIdx/endIdx and other outputs may have a "gap"
                *  from the startIdx.
                *
                * Example:
                *    Stochastic %K is between startIdx/endIdx, but %D output will
                *    have less data because it is a MA of %K. A gap will then
                *    exist for the %D output.
                */
               printf( "Fail: doRangeTestFixSize data missing (%d,%d,%d)\n", startIdx, endIdx, lookback );

               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_MISSING_DATA;
            }
         }
         else
         {
            /* Some output was returned. Are the returned index correct? */
            if( (outputBegIdx < startIdx) || (outputBegIdx > endIdx) || (outputBegIdx < refOutBeg))
            {
               printf( "Fail: doRangeTestFixSize bad outBegIdx\n" );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_OUTBEGIDX;
            }

            if( (outputNbElement > fixSize) || (outputNbElement > refOutNbElement) )
            {
               printf( "Fail: doRangeTestFixSize Incorrect outputNbElement\n" );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free(  outputBuffer );
               return TA_TESTUTIL_DRT_BAD_OUTNBLEMENT;
            }

            /* Is the calculated lookback too high? */
            if( outputBegIdx < lookback )
            {
               printf( "Fail: doRangeTestFixSize Lookback calculation too high? (%d)\n", lookback );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_LOOKBACK_TOO_HIGH;
            }

            /* Is the output identical to the reference? */
            relativeIdx = outputBegIdx-refOutBeg;
            for( i=0; i < outputNbElement; i++ )
            {
               if( outputIsInteger )
               {
                  if( outputBufferInt[1+i] != refBufferInt[relativeIdx+i] )
                  {
                     printf( "Fail: doRangeTestFixSize diff data for idx=%d (%d,%d)\n", i,
                              outputBufferInt[1+i], refBufferInt[relativeIdx+i] );
                     printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
                     printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
                     TA_Free( outputBuffer );
                     TA_Free( outputBufferInt );
                     return TA_TESTUTIL_DRT_DATA_DIFF_INT;
                  }
               }
               else
               {
                  val1 = outputBuffer[1+i];
                  val2 = refBuffer[relativeIdx+i];
                  if( !dataWithinReasonableRange( val1, val2, i, unstId, integerTolerance ) )
                  {
                     printf( "Fail: doRangeTestFixSize diff data for idx=%d (%e,%e)\n", i, val1, val2 );
                     printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
                     printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
                     if( val1 != 0.0 )
                        printf( "Fail: Diff %g %%\n", ((val2-val1)/val1)*100.0 );
                     TA_Free( outputBuffer );
                     TA_Free( outputBufferInt );
                     return TA_TESTUTIL_DRT_DATA_DIFF;
                  }
               }

               /* Randomly skip the verification of some value. Limit
                * cases are always checked though.
                */
               if( outputNbElement > 30 )
               {
                  temp = outputNbElement-20;
                  if( (i > 20) && (i < temp) )
                  {
                     /* Randomly skips from 0 to 200 verification.
                      * Never make it skip the last 20 values.
                      */
                     i += (rand() % 200);
                     if( i > temp )
                        i = temp;
                  }
               }
            }

            /* Verify out-of-bound writing in the output buffer. */
            outputSizeByOptimalLogic = max(lookback,startIdx);
            if( outputSizeByOptimalLogic > endIdx )
               outputSizeByOptimalLogic = 0;
            else
               outputSizeByOptimalLogic = endIdx-outputSizeByOptimalLogic+1;

            if( (fixSize != outputNbElement) && (outputBuffer[1+outputSizeByOptimalLogic] != RESV_PATTERN_IMPROBABLE) )
            {
               printf( "Fail: doRangeTestFixSize out-of-bound output (%e)\n", outputBuffer[1+outputSizeByOptimalLogic] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT;
            }

            if( (fixSize != outputNbElement) && (outputBufferInt[1+outputSizeByOptimalLogic] != RESV_PATTERN_IMPROBABLE_INT) )
            {
               printf( "Fail: doRangeTestFixSize out-of-bound output  (%d)\n", outputBufferInt[1+outputSizeByOptimalLogic] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT_INT;
            }

            /* Verify that the memory guard were preserved. */
            if( outputBuffer[0] != RESV_PATTERN_PREFIX )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX (%e)\n", outputBuffer[0] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_PREFIX;
            }

            if( outputBufferInt[0] != RESV_PATTERN_PREFIX_INT )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX_INT (%d)\n", outputBufferInt[0] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_PREFIX;
            }

            if( outputBuffer[fixSize+1] != RESV_PATTERN_SUFFIX )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_SUFFIX (%e)\n", outputBuffer[fixSize+1] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_SUFFIX;
            }

            if( outputBufferInt[fixSize+1] != RESV_PATTERN_SUFFIX_INT )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_SUFFIX_INT (%d)\n", outputBufferInt[fixSize+1] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_SUFFIX;
            }

            /* Clean-up for next test. */
            if( outputIsInteger )
            {
               for( i=1; i <= fixSize; i++ )
                  outputBufferInt[i] = RESV_PATTERN_IMPROBABLE_INT;
            }
            else
            {
               for( i=1; i <= fixSize; i++ )
                  outputBuffer[i] = RESV_PATTERN_IMPROBABLE;
            }
         }

         /* Skip some startIdx at random. Limit case are still
          * tested though.
          */
         if( (startIdx > 30) && ((startIdx+100) <= (MAX_RANGE_SIZE-fixSize)) )
         {
            /* Randomly skips from 40 to 100 tests. */
            temp = (rand() % 100)+40;
            startIdx += temp;
         }
      }

      /* Loop and move forward for the next startIdx to test. */
   }

   TA_Free( outputBuffer );
   TA_Free( outputBufferInt );
   return TA_TEST_PASS;
}